

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inmemorybenchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *pvVar7;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_00;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_01;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_02;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_03;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_04;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  *extraout_RAX_05;
  shared_ptr<FastPForLib::IntegerCODEC> *psVar8;
  undefined8 uVar9;
  bool bVar10;
  int __oflag;
  char *__end;
  ulong uVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  pointer pbVar14;
  ostream *poVar15;
  pointer psVar16;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  int option_index;
  string filename;
  size_t MAXCOUNTER;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codecslst;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> rawdata;
  size_t MAXLENGTH;
  size_t MINLENGTH;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> myalgos;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  tmp;
  MaropuGapReader reader;
  CODECFactory factory;
  processparameters local_338;
  string local_330;
  ulong local_310;
  ulong local_308;
  uint local_2fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2d8;
  ulong local_2b8;
  ulong local_2b0;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> local_2a8;
  char **local_288;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  local_280;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [32];
  FILE *pFStack_1e8;
  pointer pdStack_1e0;
  pointer pdStack_1d8;
  pointer pdStack_1d0;
  pointer pdStack_1c8;
  pointer pdStack_1c0;
  pointer local_1b8;
  pointer pdStack_1b0;
  pointer pdStack_1a8;
  pointer pdStack_1a0;
  pointer pdStack_198;
  ios_base iStack_190;
  undefined7 uStack_18f;
  undefined1 uStack_188;
  undefined7 uStack_187;
  undefined1 uStack_180;
  undefined7 uStack_17f;
  undefined1 uStack_178;
  undefined7 uStack_177;
  undefined1 uStack_170;
  undefined7 uStack_16f;
  undefined1 uStack_168;
  undefined7 uStack_167;
  undefined1 uStack_160;
  undefined7 uStack_15f;
  undefined1 uStack_158;
  undefined7 uStack_157;
  bool bStack_150;
  undefined1 local_80 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
  local_60;
  undefined1 auVar17 [16];
  
  local_310 = CONCAT44(local_310._4_4_,argc);
  if (argc < 2) {
    message(*argv);
    return -1;
  }
  local_2b0 = 1;
  local_308 = 0xffffffffffffffff;
  local_2b8 = 0xffffffff;
  FastPForLib::CODECFactory::CODECFactory((CODECFactory *)&local_60);
  pvVar7 = FastPForLib::CODECFactory::allSchemes(&local_280,(CODECFactory *)&local_60);
  local_2a8.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_280.
      super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.
      super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar16 = local_280.
              super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_208._0_8_ =
           (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_208._8_8_ =
           (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      p_Var2 = (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      uStack_178 = 0;
      uStack_177 = 0;
      uStack_170 = 0;
      uStack_16f = 0;
      uStack_168 = 0;
      uStack_167 = 0;
      uStack_160 = 0;
      uStack_15f = 0;
      uStack_158 = 0;
      uStack_157 = 0;
      bStack_150 = false;
      local_1b8 = (pointer)0x0;
      pdStack_1b0 = (pointer)0x0;
      pdStack_1a8 = (pointer)0x0;
      pdStack_1a0 = (pointer)0x0;
      pdStack_198 = (pointer)0x0;
      iStack_190 = (ios_base)0x0;
      uStack_18f = 0;
      uStack_188 = 0;
      uStack_187 = 0;
      uStack_180 = 0;
      uStack_17f = 0;
      local_208._16_8_ = (pointer)0x0;
      local_208._24_8_ = (pointer)0x0;
      pFStack_1e8 = (FILE *)0x0;
      pdStack_1e0 = (pointer)0x0;
      pdStack_1d8 = (pointer)0x0;
      pdStack_1d0 = (pointer)0x0;
      pdStack_1c8 = (pointer)0x0;
      pdStack_1c0 = (pointer)0x0;
      std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
      emplace_back<FastPForLib::algostats>(&local_2a8,(algostats *)local_208);
      if (pdStack_198 != (pointer)0x0) {
        operator_delete(pdStack_198);
      }
      if (pdStack_1b0 != (pointer)0x0) {
        operator_delete(pdStack_1b0);
      }
      if (pdStack_1c8 != (pointer)0x0) {
        operator_delete(pdStack_1c8);
      }
      if (pdStack_1e0 != (pointer)0x0) {
        operator_delete(pdStack_1e0);
      }
      if ((pointer)local_208._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._16_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
      }
      local_208._0_8_ =
           (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_208._8_8_ =
           (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      p_Var2 = (psVar16->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      uStack_178 = 0;
      uStack_177 = 0;
      uStack_170 = 0;
      uStack_16f = 0;
      uStack_168 = 0;
      uStack_167 = 0;
      uStack_160 = 0;
      uStack_15f = 0;
      uStack_158 = 0;
      uStack_157 = 0;
      local_1b8 = (pointer)0x0;
      pdStack_1b0 = (pointer)0x0;
      pdStack_1a8 = (pointer)0x0;
      pdStack_1a0 = (pointer)0x0;
      pdStack_198 = (pointer)0x0;
      iStack_190 = (ios_base)0x0;
      uStack_18f = 0;
      uStack_188 = 0;
      uStack_187 = 0;
      uStack_180 = 0;
      uStack_17f = 0;
      local_208._16_8_ = (pointer)0x0;
      local_208._24_8_ = (pointer)0x0;
      pFStack_1e8 = (FILE *)0x0;
      pdStack_1e0 = (pointer)0x0;
      pdStack_1d8 = (pointer)0x0;
      pdStack_1d0 = (pointer)0x0;
      pdStack_1c8 = (pointer)0x0;
      pdStack_1c0 = (pointer)0x0;
      bStack_150 = true;
      std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
      emplace_back<FastPForLib::algostats>(&local_2a8,(algostats *)local_208);
      pvVar7 = extraout_RAX;
      if (pdStack_198 != (pointer)0x0) {
        operator_delete(pdStack_198);
        pvVar7 = extraout_RAX_00;
      }
      if (pdStack_1b0 != (pointer)0x0) {
        operator_delete(pdStack_1b0);
        pvVar7 = extraout_RAX_01;
      }
      if (pdStack_1c8 != (pointer)0x0) {
        operator_delete(pdStack_1c8);
        pvVar7 = extraout_RAX_02;
      }
      if (pdStack_1e0 != (pointer)0x0) {
        operator_delete(pdStack_1e0);
        pvVar7 = extraout_RAX_03;
      }
      if ((pointer)local_208._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._16_8_);
        pvVar7 = extraout_RAX_04;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
        pvVar7 = extraout_RAX_05;
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 !=
             local_280.
             super__Vector_base<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  peVar1 = (element_type *)(local_208 + 0x10);
  bVar10 = false;
  local_2fc = (uint)CONCAT71((int7)((ulong)pvVar7 >> 8),1);
  local_288 = argv;
LAB_00108e99:
  local_338.needtodelta = false;
  local_338.fulldisplay = false;
  local_338.displayhistogram = false;
  local_338.computeentropy = false;
  iVar6 = getopt_long(local_310 & 0xffffffff,local_288,"DSc:n:m:M:",long_options,&local_338);
  if (iVar6 < 99) {
    if (iVar6 < 0x4d) {
      if (iVar6 != 0x44) {
        if (iVar6 == -1) {
          if (_optind < (int)local_310) {
            std::__cxx11::string::string
                      ((string *)&local_330,local_288[_optind],(allocator *)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# parsing ",10);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_330._M_dataplus._M_p,
                                 local_330._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            _Var12._M_p = local_330._M_dataplus._M_p;
            local_208._0_8_ = peVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,local_330._M_dataplus._M_p,
                       local_330._M_dataplus._M_p + local_330._M_string_length);
            local_2d8.field_2._M_allocated_capacity = 0;
            pFStack_1e8 = (FILE *)0x0;
            local_2d8._M_dataplus._M_p = (pointer)0x0;
            local_2d8._M_string_length = 0;
            FastPForLib::MaropuGapReader::open((MaropuGapReader *)local_208,_Var12._M_p,__oflag);
            if (local_308 != 0) {
              local_310 = 0;
              do {
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"# Filling up a block ",0x15);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
                std::ostream::put(-0x48);
                std::ostream::flush();
                auVar17._8_8_ = extraout_XMM1_Qb;
                auVar17._0_8_ = extraout_XMM1_Qa;
                uVar11 = 0;
                do {
                  do {
                    bVar5 = FastPForLib::MaropuGapReader::
                            loadIntegers<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                                      ((MaropuGapReader *)local_208,
                                       (vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                        *)&local_2d8);
                    if (!bVar5) {
LAB_00109802:
                      if (uVar11 == 0) {
                        std::
                        vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                        ::~vector((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                                   *)&local_2f8);
                        goto LAB_001099f9;
                      }
                      goto LAB_0010980b;
                    }
                    uVar13 = (long)(local_2d8._M_string_length - (long)local_2d8._M_dataplus._M_p)
                             >> 2;
                  } while ((uVar13 < local_2b0) || (local_2b8 < uVar13));
                  std::
                  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  ::push_back((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                               *)&local_2f8,(value_type *)&local_2d8);
                  uVar11 = uVar11 + uVar13;
                  local_310 = local_310 + 1;
                  if (local_308 <= local_310) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"#breaking early",0xf);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
                    std::ostream::put(-0x48);
                    std::ostream::flush();
                    auVar17._8_8_ = extraout_XMM1_Qb_00;
                    auVar17._0_8_ = extraout_XMM1_Qa_00;
                    goto LAB_00109802;
                  }
                } while (uVar11 < 0x6400000);
LAB_0010980b:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"# read ",7);
                auVar17 = vcvtusi2sd_avx512f(auVar17,uVar11);
                *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 3;
                poVar15 = std::ostream::_M_insert<double>(auVar17._0_8_ * 4.0 * 9.5367431640625e-07)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," MB, ",5);
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," arrays.",8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"# processing block",0x12);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
                std::ostream::put(-0x48);
                std::ostream::flush();
                if ((local_2fc & 1) != 0) {
                  FastPForLib::
                  splitLongArrays<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                            ((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                              *)&local_2f8,0x10000);
                }
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                local_338.needtodelta = true;
                local_338.fulldisplay = false;
                local_338.displayhistogram = false;
                local_338.computeentropy = false;
                local_338.cumulative = true;
                local_338.separatetimes = bVar10;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
                FastPForLib::Delta::
                process<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                          (&local_2a8,
                           (vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                            *)&local_2f8,&local_338,&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p);
                }
                std::
                vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                ::~vector((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                           *)&local_2f8);
              } while (local_310 < local_308);
            }
LAB_001099f9:
            if (pFStack_1e8 != (FILE *)0x0) {
              fclose(pFStack_1e8);
              pFStack_1e8 = (FILE *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# build summary...",0x12);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            local_80._0_8_ = (pointer)(local_80 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"#","");
            FastPForLib::summarize(&local_2a8,(string *)local_80);
            if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
              operator_delete((void *)local_80._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_2d8._M_dataplus._M_p +
                              -*(size_type *)(local_2d8._M_dataplus._M_p + -8));
            }
            FastPForLib::MaropuGapReader::~MaropuGapReader((MaropuGapReader *)local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p);
            }
            iVar6 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"  you must specify a file ",0x1a);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
            std::ostream::put(-0x30);
            iVar6 = -1;
            std::ostream::flush();
          }
          std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::~vector
                    (&local_2a8);
          std::
          vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
          ::~vector(&local_280);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
          ::~_Rb_tree(&local_60);
          return iVar6;
        }
        goto LAB_001095be;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# Outputting separate delta and inverseDelta times.",0x33);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      bVar10 = true;
      std::ostream::flush();
      goto LAB_00108e99;
    }
    if (iVar6 == 0x4d) {
      std::__cxx11::string::string((string *)&local_330,_optarg,(allocator *)&local_2d8);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_208,(string *)&local_330,_S_in);
      std::istream::_M_extract<unsigned_long>((ulong *)local_208);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_208);
      std::ios_base::~ios_base(&iStack_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# MAXLENGTH = ",0xe)
      ;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      goto LAB_001095f8;
    }
    if (iVar6 == 0x53) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "#\n# disabling partition of big arrays. Performance may suffer.\n#",0x40);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      local_2fc = 0;
      goto LAB_00108e99;
    }
LAB_001095be:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unrecognized flag",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    poVar15 = (ostream *)&std::cerr;
  }
  else {
    if (iVar6 == 99) {
      std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::_M_erase_at_end
                (&local_2a8,
                 local_2a8.
                 super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::string((string *)&local_330,_optarg,(allocator *)local_208);
      iVar6 = std::__cxx11::string::compare((char *)&local_330);
      if (iVar6 != 0) {
        local_208._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,",:;","");
        FastPForLib::split(&local_2f8,&local_330,(string *)local_208);
        pbVar14 = local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)local_208._0_8_ != peVar1) {
          operator_delete((void *)local_208._0_8_);
          pbVar14 = local_2f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; pbVar14 !=
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# pretty name = ",0x10);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(pbVar14->_M_dataplus)._M_p,
                               pbVar14->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if (pbVar14->_M_string_length == 0) {
            uVar9 = std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if ((pointer)local_80._0_8_ != pbVar14) {
              operator_delete((void *)local_80._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_2d8._M_dataplus._M_p +
                              -*(size_type *)(local_2d8._M_dataplus._M_p + -8));
            }
            FastPForLib::MaropuGapReader::~MaropuGapReader((MaropuGapReader *)local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p);
            }
            std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::~vector
                      (&local_2a8);
            std::
            vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
            ::~vector(&local_280);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
            ::~_Rb_tree(&local_60);
            _Unwind_Resume(uVar9);
          }
          if (*(pbVar14->_M_dataplus)._M_p == '@') {
            std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pbVar14);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,local_2d8._M_dataplus._M_p,
                       local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
            psVar8 = FastPForLib::CODECFactory::getFromName((CODECFactory *)&local_60,&local_228);
            local_208._0_8_ =
                 (psVar8->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
            local_208._8_8_ =
                 (psVar8->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
            p_Var2 = (psVar8->
                     super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            uStack_178 = 0;
            uStack_177 = 0;
            uStack_170 = 0;
            uStack_16f = 0;
            uStack_168 = 0;
            uStack_167 = 0;
            uStack_160 = 0;
            uStack_15f = 0;
            uStack_158 = 0;
            uStack_157 = 0;
            local_1b8 = (pointer)0x0;
            pdStack_1b0 = (pointer)0x0;
            pdStack_1a8 = (pointer)0x0;
            pdStack_1a0 = (pointer)0x0;
            pdStack_198 = (pointer)0x0;
            iStack_190 = (ios_base)0x0;
            uStack_18f = 0;
            uStack_188 = 0;
            uStack_187 = 0;
            uStack_180 = 0;
            uStack_17f = 0;
            local_208._16_8_ = (pointer)0x0;
            local_208._24_8_ = (pointer)0x0;
            pFStack_1e8 = (FILE *)0x0;
            pdStack_1e0 = (pointer)0x0;
            pdStack_1d8 = (pointer)0x0;
            pdStack_1d0 = (pointer)0x0;
            pdStack_1c8 = (pointer)0x0;
            pdStack_1c0 = (pointer)0x0;
            bStack_150 = true;
            std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
            emplace_back<FastPForLib::algostats>(&local_2a8,(algostats *)local_208);
            if (pdStack_198 != (pointer)0x0) {
              operator_delete(pdStack_198);
            }
            if (pdStack_1b0 != (pointer)0x0) {
              operator_delete(pdStack_1b0);
            }
            if (pdStack_1c8 != (pointer)0x0) {
              operator_delete(pdStack_1c8);
            }
            if (pdStack_1e0 != (pointer)0x0) {
              operator_delete(pdStack_1e0);
            }
            if ((pointer)local_208._16_8_ != (pointer)0x0) {
              operator_delete((void *)local_208._16_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            psVar4 = &local_2d8;
            _Var12._M_p = local_2d8._M_dataplus._M_p;
          }
          else {
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            pcVar3 = (pbVar14->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,pcVar3,pcVar3 + pbVar14->_M_string_length);
            psVar8 = FastPForLib::CODECFactory::getFromName((CODECFactory *)&local_60,&local_248);
            local_208._0_8_ =
                 (psVar8->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
            local_208._8_8_ =
                 (psVar8->super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
            p_Var2 = (psVar8->
                     super___shared_ptr<FastPForLib::IntegerCODEC,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            uStack_178 = 0;
            uStack_177 = 0;
            uStack_170 = 0;
            uStack_16f = 0;
            uStack_168 = 0;
            uStack_167 = 0;
            uStack_160 = 0;
            uStack_15f = 0;
            uStack_158 = 0;
            uStack_157 = 0;
            bStack_150 = false;
            local_1b8 = (pointer)0x0;
            pdStack_1b0 = (pointer)0x0;
            pdStack_1a8 = (pointer)0x0;
            pdStack_1a0 = (pointer)0x0;
            pdStack_198 = (pointer)0x0;
            iStack_190 = (ios_base)0x0;
            uStack_18f = 0;
            uStack_188 = 0;
            uStack_187 = 0;
            uStack_180 = 0;
            uStack_17f = 0;
            local_208._16_8_ = (pointer)0x0;
            local_208._24_8_ = (pointer)0x0;
            pFStack_1e8 = (FILE *)0x0;
            pdStack_1e0 = (pointer)0x0;
            pdStack_1d8 = (pointer)0x0;
            pdStack_1d0 = (pointer)0x0;
            pdStack_1c8 = (pointer)0x0;
            pdStack_1c0 = (pointer)0x0;
            std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
            emplace_back<FastPForLib::algostats>(&local_2a8,(algostats *)local_208);
            if (pdStack_198 != (pointer)0x0) {
              operator_delete(pdStack_198);
            }
            if (pdStack_1b0 != (pointer)0x0) {
              operator_delete(pdStack_1b0);
            }
            if (pdStack_1c8 != (pointer)0x0) {
              operator_delete(pdStack_1c8);
            }
            if (pdStack_1e0 != (pointer)0x0) {
              operator_delete(pdStack_1e0);
            }
            if ((pointer)local_208._16_8_ != (pointer)0x0) {
              operator_delete((void *)local_208._16_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
            }
            psVar4 = &local_248;
            _Var12._M_p = local_248._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var12._M_p != &psVar4->field_2) {
            operator_delete(_Var12._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# added \'",9);
          FastPForLib::algostats::name_abi_cxx11_
                    ((string *)local_208,
                     local_2a8.
                     super__Vector_base<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_208._0_8_,local_208._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if ((element_type *)local_208._0_8_ != peVar1) {
            operator_delete((void *)local_208._0_8_);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      goto LAB_00108e99;
    }
    if (iVar6 == 0x6d) {
      std::__cxx11::string::string((string *)&local_330,_optarg,(allocator *)&local_2d8);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_208,(string *)&local_330,_S_in);
      std::istream::_M_extract<unsigned_long>((ulong *)local_208);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_208);
      std::ios_base::~ios_base(&iStack_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# MINLENGTH = ",0xe)
      ;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
    else {
      if (iVar6 != 0x6e) goto LAB_001095be;
      std::__cxx11::string::string((string *)&local_330,_optarg,(allocator *)&local_2d8);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_208,(string *)&local_330,_S_in);
      std::istream::_M_extract<unsigned_long>((ulong *)local_208);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_208);
      std::ios_base::~ios_base(&iStack_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# MAXCOUNTER = ",0xf);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
  }
LAB_001095f8:
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  goto LAB_00108e99;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    message(argv[0]);
    return -1;
  }
  bool splitlongarrays = true;
  bool separatedeltatimes = false;
  size_t MINLENGTH = 1;
  size_t MAXLENGTH = (std::numeric_limits<uint32_t>::max)();
  size_t MAXCOUNTER = (std::numeric_limits<std::size_t>::max)();
  CODECFactory factory;
  vector<shared_ptr<IntegerCODEC>> tmp =
      factory.allSchemes(); // the default
  vector<algostats> myalgos;
  for (auto i = tmp.begin(); i != tmp.end(); ++i) {
    myalgos.push_back(algostats(*i));
    myalgos.push_back(algostats(*i, true)); // by default?
  }
  int c;
  while (1) {
    int option_index = 0;
    c = getopt_long(argc, argv, "DSc:n:m:M:", long_options, &option_index);
    if (c == -1)
      break;
    switch (c) {
    case 'D':
      cout << "# Outputting separate delta and inverseDelta times." << endl;
      separatedeltatimes = true;
      break;
    case 'S':
      cout << "#\n# disabling partition of big arrays. Performance may "
              "suffer.\n#"
           << endl;
      splitlongarrays = false;
      break;
    case 'm':
      istringstream(optarg) >> MINLENGTH;
      cout << "# MINLENGTH = " << MINLENGTH << endl;
      break;
    case 'M':
      istringstream(optarg) >> MAXLENGTH;
      cout << "# MAXLENGTH = " << MAXLENGTH << endl;
      break;
    case 'n':
      istringstream(optarg) >> MAXCOUNTER;
      cout << "# MAXCOUNTER = " << MAXCOUNTER << endl;
      break;
    case 'c': {
      myalgos.clear();
      string codecsstr(optarg);
      if (codecsstr.compare("NONE") != 0) {
        vector<string> codecslst = split(codecsstr, ",:;");
        for (auto i = codecslst.begin(); i != codecslst.end(); ++i) {
          cout << "# pretty name = " << *i << endl;
          if (i->at(0) == '@') { // SIMD
            string namewithoutprefix = i->substr(1, i->size() - 1);
            myalgos.push_back(
                algostats(factory.getFromName(namewithoutprefix), true));
          } else {
            myalgos.push_back(algostats(factory.getFromName(*i)));
          }
          cout << "# added '" << myalgos.back().name() << "'" << endl;
        }
      }
    } break;
    default:
      cerr << "unrecognized flag" << endl;
      break;
    }
  }

  if (argc - optind < 1) {
    cerr << "  you must specify a file " << endl;
    return -1;
  }
  string filename = argv[optind];

  cout << "# parsing " << filename << endl;
  MaropuGapReader reader(filename);

  vector<uint32_t, cacheallocator> rawdata;
  reader.open();
  size_t counter = 0;
  const size_t MAXBLOCKSIZE = 104857600; // 400 MB
  while (counter < MAXCOUNTER) {
    // collecting the data up to MAXBLOCKSIZE integers
    vector<vector<uint32_t, cacheallocator>> datas;
    size_t datastotalsize = 0;
    cout << "# Filling up a block " << endl;
    while (reader.loadIntegers(rawdata)) {
      if ((rawdata.size() < MINLENGTH) || (rawdata.size() > MAXLENGTH))
        continue;
      ++counter;
      datastotalsize += rawdata.size();
      datas.push_back(rawdata);
      if (counter >= MAXCOUNTER) {
        cout << "#breaking early" << endl;
        break;
      }
      if (datastotalsize >= MAXBLOCKSIZE)
        break;
    }
    if (datastotalsize == 0)
      break;
    cout << "# read " << std::setprecision(3)
         << static_cast<double>(datastotalsize) * 4.0 / (1024.0 * 1024.0)
         << " MB, " << datas.size() << " arrays." << endl;

    cout << "# processing block" << endl;
    if (splitlongarrays)
      splitLongArrays(datas);
    processparameters pp(true, false, false, false, true, separatedeltatimes);
    Delta::process(myalgos, datas,
                   pp); // done collecting data, now allocating memory
  }
  reader.close();
  cout << "# build summary..." << endl;
  summarize(myalgos);
}